

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O0

void __thiscall pbrt::Transform::Transform(Transform *this,Quaternion *q)

{
  float fVar1;
  undefined1 auVar2 [16];
  float *pfVar3;
  float *in_RSI;
  SquareMatrix<4> *in_RDI;
  float i;
  Float wz;
  Float wy;
  Float wx;
  Float yz;
  Float xz;
  Float xy;
  Float zz;
  Float yy;
  Float xx;
  undefined4 in_stack_fffffffffffffed0;
  float fVar4;
  undefined4 in_stack_fffffffffffffed4;
  float fVar5;
  undefined1 local_108 [8];
  SquareMatrix<4> *in_stack_ffffffffffffff00;
  span<float> local_c8;
  span<float> local_b8;
  span<float> local_a8;
  span<float> local_98;
  span<float> local_88;
  span<float> local_78;
  span<float> local_68;
  span<float> local_58;
  span<float> local_48;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  float *local_10;
  
  local_10 = in_RSI;
  SquareMatrix<4>::SquareMatrix(in_RDI);
  SquareMatrix<4>::SquareMatrix(in_RDI + 1);
  local_14 = *local_10 * *local_10;
  local_18 = local_10[1] * local_10[1];
  local_1c = local_10[2] * local_10[2];
  local_20 = *local_10 * local_10[1];
  local_24 = *local_10 * local_10[2];
  local_28 = local_10[1] * local_10[2];
  local_2c = *local_10 * local_10[3];
  local_30 = local_10[1] * local_10[3];
  local_34 = local_10[2] * local_10[3];
  auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)(local_18 + local_1c)),
                           SUB6416(ZEXT464(0x3f800000),0));
  i = auVar2._0_4_;
  local_48 = SquareMatrix<4>::operator[]
                       ((SquareMatrix<4> *)
                        CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),(int)i);
  pfVar3 = pstd::span<float>::operator[](&local_48,0);
  *pfVar3 = i;
  fVar4 = (local_20 + local_34) * 2.0;
  local_58 = SquareMatrix<4>::operator[]
                       ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffffed4,fVar4),(int)i);
  pfVar3 = pstd::span<float>::operator[](&local_58,1);
  *pfVar3 = fVar4;
  fVar5 = (local_24 - local_30) * 2.0;
  local_68 = SquareMatrix<4>::operator[]((SquareMatrix<4> *)CONCAT44(fVar5,fVar4),(int)i);
  pfVar3 = pstd::span<float>::operator[](&local_68,2);
  *pfVar3 = fVar5;
  fVar1 = local_20 - local_34;
  local_78 = SquareMatrix<4>::operator[]((SquareMatrix<4> *)CONCAT44(fVar5,fVar4),(int)i);
  pfVar3 = pstd::span<float>::operator[](&local_78,0);
  *pfVar3 = fVar1 * 2.0;
  auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)(local_14 + local_1c)),
                           SUB6416(ZEXT464(0x3f800000),0));
  local_88 = SquareMatrix<4>::operator[]((SquareMatrix<4> *)CONCAT44(fVar5,fVar4),(int)i);
  pfVar3 = pstd::span<float>::operator[](&local_88,1);
  *pfVar3 = auVar2._0_4_;
  fVar1 = local_28 + local_2c;
  local_98 = SquareMatrix<4>::operator[]((SquareMatrix<4> *)CONCAT44(fVar5,fVar4),(int)i);
  pfVar3 = pstd::span<float>::operator[](&local_98,2);
  *pfVar3 = fVar1 * 2.0;
  fVar1 = local_24 + local_30;
  local_a8 = SquareMatrix<4>::operator[]((SquareMatrix<4> *)CONCAT44(fVar5,fVar4),(int)i);
  pfVar3 = pstd::span<float>::operator[](&local_a8,0);
  *pfVar3 = fVar1 * 2.0;
  fVar1 = local_28 - local_2c;
  local_b8 = SquareMatrix<4>::operator[]((SquareMatrix<4> *)CONCAT44(fVar5,fVar4),(int)i);
  pfVar3 = pstd::span<float>::operator[](&local_b8,1);
  *pfVar3 = fVar1 * 2.0;
  auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)(local_14 + local_18)),
                           SUB6416(ZEXT464(0x3f800000),0));
  local_c8 = SquareMatrix<4>::operator[]((SquareMatrix<4> *)CONCAT44(fVar5,fVar4),(int)i);
  pfVar3 = pstd::span<float>::operator[](&local_c8,2);
  *pfVar3 = auVar2._0_4_;
  Transpose<4>(in_stack_ffffffffffffff00);
  memcpy(in_RDI,local_108,0x40);
  return;
}

Assistant:

inline Transform::Transform(const Quaternion &q) {
    Float xx = q.v.x * q.v.x, yy = q.v.y * q.v.y, zz = q.v.z * q.v.z;
    Float xy = q.v.x * q.v.y, xz = q.v.x * q.v.z, yz = q.v.y * q.v.z;
    Float wx = q.v.x * q.w, wy = q.v.y * q.w, wz = q.v.z * q.w;

    mInv[0][0] = 1 - 2 * (yy + zz);
    mInv[0][1] = 2 * (xy + wz);
    mInv[0][2] = 2 * (xz - wy);
    mInv[1][0] = 2 * (xy - wz);
    mInv[1][1] = 1 - 2 * (xx + zz);
    mInv[1][2] = 2 * (yz + wx);
    mInv[2][0] = 2 * (xz + wy);
    mInv[2][1] = 2 * (yz - wx);
    mInv[2][2] = 1 - 2 * (xx + yy);

    // Transpose since we are left-handed.  Ugh.
    m = Transpose(mInv);
}